

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O1

Array<float,_NUM_EDGES>
Rml::ElementHandleTargetData::ResolveEdgeMargin
          (Element *target,Box *box,Array<NumericValue,_NUM_EDGES> *edge_margin)

{
  int i;
  long lVar1;
  float fVar2;
  Array<float,_NUM_EDGES> AVar3;
  Array<float,_NUM_EDGES> resolved_edge_margin;
  Vector2f target_size;
  undefined8 local_38;
  undefined8 uStack_30;
  Vector2f local_20;
  
  local_20 = Box::GetSize(box,Border);
  local_38 = 0;
  uStack_30 = 0;
  lVar1 = 0;
  do {
    fVar2 = -3.4028235e+38;
    if (edge_margin->_M_elems[lVar1].unit != UNKNOWN) {
      fVar2 = Element::ResolveNumericValue
                        (target,edge_margin->_M_elems[lVar1],(&local_20.x)[~(uint)lVar1 & 1]);
      fVar2 = Math::Round(fVar2);
    }
    *(float *)((long)&local_38 + lVar1 * 4) = fVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  AVar3._M_elems[0] = (float)(undefined4)local_38;
  AVar3._M_elems[1] = (float)local_38._4_4_;
  AVar3._M_elems[2] = (float)(undefined4)uStack_30;
  AVar3._M_elems[3] = (float)uStack_30._4_4_;
  return (Array<float,_NUM_EDGES>)AVar3._M_elems;
}

Assistant:

static Array<float, NUM_EDGES> ResolveEdgeMargin(Element* target, const Box& box, const Array<NumericValue, NUM_EDGES>& edge_margin)
	{
		const Vector2f target_size = box.GetSize(BoxArea::Border);
		Array<float, NUM_EDGES> resolved_edge_margin = {};
		for (int i = 0; i < NUM_EDGES; i++)
		{
			resolved_edge_margin[i] = (edge_margin[i].unit == Unit::UNKNOWN
					? -FLT_MAX
					: Math::Round(target->ResolveNumericValue(edge_margin[i], target_size[(i == LEFT || i == RIGHT) ? 0 : 1])));
		}
		return resolved_edge_margin;
	}